

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirENCODING(void)

{
  int iVar1;
  int iVar2;
  char *aP;
  string arg;
  
  GetDelimitedString_abi_cxx11_(&arg,&lp);
  aP = arg._M_dataplus._M_p;
  iVar1 = cmphstr(&aP,"dos",false);
  iVar2 = 0;
  if (iVar1 == 0) {
    iVar2 = cmphstr(&aP,"win",false);
    if (iVar2 == 0) {
      Error("[ENCODING] Invalid argument (valid values: \"dos\" and \"win\")",aP,IF_FIRST);
      iVar2 = ConvertEncoding;
    }
    else {
      iVar2 = 1;
    }
  }
  ConvertEncoding = iVar2;
  std::__cxx11::string::~string((string *)&arg);
  return;
}

Assistant:

static void dirENCODING() {
	auto arg = GetDelimitedString(lp);
	char* aP = arg.data();
	if (cmphstr(aP, "dos")) {
		ConvertEncoding = ENCDOS;
	} else if (cmphstr(aP, "win")) {
		ConvertEncoding = ENCWIN;
	} else {
		Error("[ENCODING] Invalid argument (valid values: \"dos\" and \"win\")", aP, IF_FIRST);
	}
}